

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::to_multi_member_reference_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type,
          SmallVector<unsigned_int,_8UL> *indices)

{
  uint index;
  uint *puVar1;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  long lVar3;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar1 = (indices->super_VectorView<unsigned_int>).ptr;
  sVar2 = (indices->super_VectorView<unsigned_int>).buffer_size;
  for (lVar3 = 0; sVar2 << 2 != lVar3; lVar3 = lVar3 + 4) {
    index = *(uint *)((long)puVar1 + lVar3);
    ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)index;
    to_member_name_abi_cxx11_(&local_70,this,type,index);
    join<char_const(&)[2],std::__cxx11::string>
              (&local_50,(spirv_cross *)0x30abe2,(char (*) [2])&local_70,ts_1);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_70);
    type = Compiler::get<spirv_cross::SPIRType>
                     (&this->super_Compiler,
                      (type->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                      [*(uint *)((long)puVar1 + lVar3)].id);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_multi_member_reference(const SPIRType &type, const SmallVector<uint32_t> &indices)
{
	string ret;
	auto *member_type = &type;
	for (auto &index : indices)
	{
		ret += join(".", to_member_name(*member_type, index));
		member_type = &get<SPIRType>(member_type->member_types[index]);
	}
	return ret;
}